

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredImage::LayeredImage
          (LayeredImage *this,TextureType type,TextureFormat *format,int w,int h,int d)

{
  Texture1D *this_00;
  SharedPtrStateBase *pSVar1;
  TextureCube *this_01;
  Texture2D *this_02;
  Texture3D *this_03;
  Texture2DArray *this_04;
  int i;
  CubeFace face;
  
  this->m_type = type;
  (this->m_size).m_data[0] = w;
  (this->m_size).m_data[1] = h;
  (this->m_size).m_data[2] = d;
  this->m_format = *format;
  if (type == TEXTURETYPE_BUFFER) {
    this_00 = (Texture1D *)operator_new(0x50);
    tcu::Texture1D::Texture1D(this_00,format,w);
    tcu::Texture1D::allocLevel(this_00,0);
    (this->m_texBuffer).m_state = (SharedPtrStateBase *)0x0;
    (this->m_texBuffer).m_ptr = this_00;
    pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar1->strongRefCount = 0;
    pSVar1->weakRefCount = 0;
    pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02163210;
    pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
    (this->m_texBuffer).m_state = pSVar1;
    pSVar1->strongRefCount = 1;
    pSVar1->weakRefCount = 1;
    (this->m_tex2D).m_ptr = (Texture2D *)0x0;
    (this->m_tex2D).m_state = (SharedPtrStateBase *)0x0;
  }
  else {
    (this->m_texBuffer).m_ptr = (Texture1D *)0x0;
    (this->m_texBuffer).m_state = (SharedPtrStateBase *)0x0;
    if (type == TEXTURETYPE_2D) {
      this_02 = (Texture2D *)operator_new(0x50);
      tcu::Texture2D::Texture2D(this_02,format,w,h);
      tcu::Texture2D::allocLevel(this_02,0);
      (this->m_tex2D).m_state = (SharedPtrStateBase *)0x0;
      (this->m_tex2D).m_ptr = this_02;
      pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar1->strongRefCount = 0;
      pSVar1->weakRefCount = 0;
      pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02163250;
      pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)this_02;
      (this->m_tex2D).m_state = pSVar1;
      pSVar1->strongRefCount = 1;
      pSVar1->weakRefCount = 1;
    }
    else {
      (this->m_tex2D).m_ptr = (Texture2D *)0x0;
      (this->m_tex2D).m_state = (SharedPtrStateBase *)0x0;
      if (type == TEXTURETYPE_CUBE) {
        this_01 = (TextureCube *)operator_new(0x168);
        tcu::TextureCube::TextureCube(this_01,format,w);
        face = CUBEFACE_NEGATIVE_X;
        do {
          tcu::TextureCube::allocLevel(this_01,face,0);
          face = face + CUBEFACE_POSITIVE_X;
        } while (face != CUBEFACE_LAST);
        (this->m_texCube).m_state = (SharedPtrStateBase *)0x0;
        (this->m_texCube).m_ptr = this_01;
        pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
        pSVar1->strongRefCount = 0;
        pSVar1->weakRefCount = 0;
        pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02163290;
        pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
        (this->m_texCube).m_state = pSVar1;
        pSVar1->strongRefCount = 1;
        pSVar1->weakRefCount = 1;
        goto LAB_01474546;
      }
    }
  }
  (this->m_texCube).m_ptr = (TextureCube *)0x0;
  (this->m_texCube).m_state = (SharedPtrStateBase *)0x0;
LAB_01474546:
  if (type == TEXTURETYPE_3D) {
    this_03 = (Texture3D *)operator_new(0x58);
    tcu::Texture3D::Texture3D(this_03,format,w,h,d);
    tcu::Texture3D::allocLevel(this_03,0);
    (this->m_tex3D).m_state = (SharedPtrStateBase *)0x0;
    (this->m_tex3D).m_ptr = this_03;
    pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar1->strongRefCount = 0;
    pSVar1->weakRefCount = 0;
    pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021632d0;
    pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)this_03;
    (this->m_tex3D).m_state = pSVar1;
    pSVar1->strongRefCount = 1;
    pSVar1->weakRefCount = 1;
  }
  else {
    (this->m_tex3D).m_ptr = (Texture3D *)0x0;
    (this->m_tex3D).m_state = (SharedPtrStateBase *)0x0;
    if (type == TEXTURETYPE_2D_ARRAY) {
      this_04 = (Texture2DArray *)operator_new(0x58);
      tcu::Texture2DArray::Texture2DArray(this_04,format,w,h,d);
      tcu::Texture2DArray::allocLevel(this_04,0);
      (this->m_tex2DArray).m_state = (SharedPtrStateBase *)0x0;
      (this->m_tex2DArray).m_ptr = this_04;
      pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar1->strongRefCount = 0;
      pSVar1->weakRefCount = 0;
      pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02163310;
      pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)this_04;
      (this->m_tex2DArray).m_state = pSVar1;
      pSVar1->strongRefCount = 1;
      pSVar1->weakRefCount = 1;
      return;
    }
  }
  (this->m_tex2DArray).m_ptr = (Texture2DArray *)0x0;
  (this->m_tex2DArray).m_state = (SharedPtrStateBase *)0x0;
  return;
}

Assistant:

LayeredImage::LayeredImage (TextureType type, const TextureFormat& format, int w, int h, int d)
	: m_type		(type)
	, m_size		(w, h, d)
	, m_format		(format)
	, m_texBuffer	(type == TEXTURETYPE_BUFFER		? SharedPtr<tcu::Texture1D>			(newOneLevelTexture1D		(format, w))		: SharedPtr<tcu::Texture1D>())
	, m_tex2D		(type == TEXTURETYPE_2D			? SharedPtr<tcu::Texture2D>			(newOneLevelTexture2D		(format, w, h))		: SharedPtr<tcu::Texture2D>())
	, m_texCube		(type == TEXTURETYPE_CUBE		? SharedPtr<tcu::TextureCube>		(newOneLevelTextureCube		(format, w))		: SharedPtr<tcu::TextureCube>())
	, m_tex3D		(type == TEXTURETYPE_3D			? SharedPtr<tcu::Texture3D>			(newOneLevelTexture3D		(format, w, h, d))	: SharedPtr<tcu::Texture3D>())
	, m_tex2DArray	(type == TEXTURETYPE_2D_ARRAY	? SharedPtr<tcu::Texture2DArray>	(newOneLevelTexture2DArray	(format, w, h, d))	: SharedPtr<tcu::Texture2DArray>())
{
	DE_ASSERT(m_size.z() == 1					||
			  m_type == TEXTURETYPE_3D			||
			  m_type == TEXTURETYPE_2D_ARRAY);

	DE_ASSERT(m_size.y() == 1					||
			  m_type == TEXTURETYPE_2D			||
			  m_type == TEXTURETYPE_CUBE		||
			  m_type == TEXTURETYPE_3D			||
			  m_type == TEXTURETYPE_2D_ARRAY);

	DE_ASSERT(w == h || type != TEXTURETYPE_CUBE);

	DE_ASSERT(m_texBuffer	!= DE_NULL ||
			  m_tex2D		!= DE_NULL ||
			  m_texCube		!= DE_NULL ||
			  m_tex3D		!= DE_NULL ||
			  m_tex2DArray	!= DE_NULL);
}